

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void CaDiCaL::fatal_message_start(void)

{
  fflush(_stdout);
  Terminal::bold((Terminal *)terr);
  fputs("cadical: ",_stderr);
  Terminal::red((Terminal *)terr,true);
  fputs("fatal error:",_stderr);
  Terminal::normal((Terminal *)terr);
  fputc(0x20,_stderr);
  return;
}

Assistant:

void fatal_message_start () {
  fflush (stdout);
  terr.bold ();
  fputs ("cadical: ", stderr);
  terr.red (1);
  fputs ("fatal error:", stderr);
  terr.normal ();
  fputc (' ', stderr);
}